

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O3

void __thiscall brown::Tile::drawcirc(Tile *this,int xc,int yc,int r,uint32_t col)

{
  uint uVar1;
  uintptr_t uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  local_3c = 1 - r;
  uVar2 = this->f;
  local_44 = xc * 4;
  iVar8 = 0;
  local_48 = 3;
  uVar6 = yc;
  uVar11 = xc;
  local_40 = local_44;
  while( true ) {
    uVar5 = r + yc;
    uVar9 = this->x;
    uVar10 = this->y;
    if (uVar5 < uVar10 && (uint)(xc + iVar8) < uVar9) {
      *(uint32_t *)(uVar2 + (long)(int)(this->p * uVar5 + local_40)) = col;
      uVar9 = this->x;
      uVar10 = this->y;
    }
    uVar7 = r + xc;
    uVar1 = yc + iVar8;
    if (uVar1 < uVar10 && uVar7 < uVar9) {
      *(uint32_t *)(uVar2 + (long)(int)(this->p * uVar1 + uVar7 * 4)) = col;
      uVar9 = this->x;
      uVar10 = this->y;
    }
    if ((uVar7 < uVar9) && (uVar6 < uVar10)) {
      *(uint32_t *)(uVar2 + (long)(int)(this->p * uVar6 + uVar7 * 4)) = col;
      uVar9 = this->x;
      uVar10 = this->y;
    }
    uVar7 = yc - r;
    if (((uint)(xc + iVar8) < uVar9) && (uVar7 < uVar10)) {
      *(uint32_t *)(uVar2 + (long)(int)(this->p * uVar7 + local_40)) = col;
      uVar9 = this->x;
      uVar10 = this->y;
    }
    if ((uVar11 < uVar9) && (uVar5 < uVar10)) {
      *(uint32_t *)(uVar2 + (long)(int)(uVar5 * this->p + local_44)) = col;
      uVar9 = this->x;
      uVar10 = this->y;
    }
    uVar5 = xc - r;
    if ((uVar5 < uVar9) && (uVar1 < uVar10)) {
      *(uint32_t *)(uVar2 + (long)(int)(uVar1 * this->p + uVar5 * 4)) = col;
      uVar9 = this->x;
      uVar10 = this->y;
    }
    if ((uVar5 < uVar9) && (uVar6 < uVar10)) {
      *(uint32_t *)(uVar2 + (long)(int)(this->p * uVar6 + uVar5 * 4)) = col;
      uVar9 = this->x;
      uVar10 = this->y;
    }
    if ((uVar11 < uVar9) && (uVar7 < uVar10)) {
      *(uint32_t *)(uVar2 + (long)(int)(uVar7 * this->p + local_44)) = col;
    }
    iVar3 = iVar8 - r;
    if (r <= iVar8) break;
    iVar4 = local_48;
    if (-1 < local_3c) {
      r = r + -1;
      iVar4 = iVar3 * 2 + 5;
    }
    local_3c = local_3c + iVar4;
    iVar8 = iVar8 + 1;
    local_48 = local_48 + 2;
    local_44 = local_44 + -4;
    uVar11 = uVar11 - 1;
    uVar6 = uVar6 - 1;
    local_40 = local_40 + 4;
  }
  return;
}

Assistant:

void Tile::drawcirc (int xc, int yc, int r, std::uint32_t col)
{
    int x, y, d;
    for(x=0,y=r,d=1-r;1;x++)
    {
        this->drawpix(xc+x,yc+y,col); this->drawpix(xc+y,yc+x,col);
        this->drawpix(xc+y,yc-x,col); this->drawpix(xc+x,yc-y,col);
        this->drawpix(xc-x,yc+y,col); this->drawpix(xc-y,yc+x,col);
        this->drawpix(xc-y,yc-x,col); this->drawpix(xc-x,yc-y,col);
        if (x >= y) break;
        if (d < 0) { d += ( x   <<1)+3; } else
                      { d += ((x-y)<<1)+5; y--; }
    }
}